

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

Message * __thiscall
google::protobuf::Reflection::AddMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  byte bVar1;
  uint32_t uVar2;
  int iVar3;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *this_01;
  MessageLite *pMVar4;
  Descriptor *pDVar5;
  undefined4 extraout_var;
  Nonnull<const_char_*> pcVar6;
  bool bVar7;
  char *description;
  Arena *arena;
  Metadata MVar8;
  
  MVar8 = Message::GetMetadata(message);
  if (MVar8.reflection != this) {
    pDVar5 = this->descriptor_;
    MVar8 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar5,MVar8.descriptor,field,"AddMessage");
  }
  pDVar5 = this->descriptor_;
  if (field->containing_type_ == pDVar5) {
    bVar1 = field->field_0x1;
    bVar7 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar7) {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (bVar7,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar6 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) != 0) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
          anon_unknown_6::ReportReflectionUsageTypeError
                    (this->descriptor_,field,"AddMessage",CPPTYPE_MESSAGE);
        }
        if (factory == (MessageFactory *)0x0) {
          factory = this->message_factory_;
        }
        if ((field->field_0x1 & 8) != 0) {
          uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
          pMVar4 = internal::ExtensionSet::AddMessage
                             ((ExtensionSet *)
                              ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2)
                              ,field,factory);
          return (Message *)pMVar4;
        }
        if (field->type_ == '\v') {
          bVar7 = FieldDescriptor::is_map_message_type(field);
          if (bVar7) {
            VerifyFieldType<google::protobuf::internal::MapFieldBase>(this,field);
            this_00 = (MapFieldBase *)MutableRawImpl(this,message,field);
            this_01 = internal::MapFieldBase::MutableRepeatedField(this_00);
            goto LAB_001f884a;
          }
        }
        VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(this,field);
        this_01 = (RepeatedPtrFieldBase *)MutableRawImpl(this,message,field);
LAB_001f884a:
        pMVar4 = &internal::RepeatedPtrFieldBase::
                  AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                            (this_01)->super_MessageLite;
        if (pMVar4 == (MessageLite *)0x0) {
          if (this_01->current_size_ == 0) {
            pDVar5 = FieldDescriptor::message_type(field);
            iVar3 = (*factory->_vptr_MessageFactory[2])(factory,pDVar5);
            pMVar4 = (MessageLite *)CONCAT44(extraout_var,iVar3);
          }
          else {
            pMVar4 = &internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                                (this_01,0)->super_MessageLite;
          }
          arena = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
          if (((ulong)arena & 1) != 0) {
            arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
          }
          pMVar4 = MessageLite::New(pMVar4,arena);
          internal::RepeatedPtrFieldBase::
          UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                    (this_01,(Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_>
                              *)pMVar4);
        }
        return (Message *)pMVar4;
      }
    }
    else {
      AddMessage();
    }
    pDVar5 = this->descriptor_;
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar5,field,"AddMessage",description);
}

Assistant:

Message* Reflection::AddMessage(Message* message, const FieldDescriptor* field,
                                MessageFactory* factory) const {
  USAGE_MUTABLE_CHECK_ALL(AddMessage, REPEATED, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->AddMessage(field, factory));
  } else {
    Message* result = nullptr;

    // We can't use AddField<Message>() because RepeatedPtrFieldBase doesn't
    // know how to allocate one.
    RepeatedPtrFieldBase* repeated = nullptr;
    if (IsMapFieldInApi(field)) {
      repeated =
          MutableRaw<MapFieldBase>(message, field)->MutableRepeatedField();
    } else {
      repeated = MutableRaw<RepeatedPtrFieldBase>(message, field);
    }
    result = repeated->AddFromCleared<GenericTypeHandler<Message> >();
    if (result == nullptr) {
      // We must allocate a new object.
      const Message* prototype;
      if (repeated->size() == 0) {
        prototype = factory->GetPrototype(field->message_type());
      } else {
        prototype = &repeated->Get<GenericTypeHandler<Message> >(0);
      }
      result = prototype->New(message->GetArena());
      // We can guarantee here that repeated and result are either both heap
      // allocated or arena owned. So it is safe to call the unsafe version
      // of AddAllocated.
      repeated->UnsafeArenaAddAllocated<GenericTypeHandler<Message> >(result);
    }

    return result;
  }
}